

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGenerator.h
# Opt level: O2

void generateHeaps(int size,int heapNumber,HeapList *heaps,vector<int,_std::allocator<int>_> *order,
                  vector<int,_std::allocator<int>_> *values)

{
  IHeap *pIVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar2 = heapNumber;
  if (size < heapNumber) {
    uVar2 = size;
  }
  uVar5 = 0;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    HeapList::AddHeap(heaps,(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar5]);
  }
  if (size <= heapNumber) {
    heapNumber = size;
  }
  for (lVar4 = (long)heapNumber; (size + heapNumber) - uVar2 != (int)lVar4; lVar4 = lVar4 + 1) {
    pIVar1 = (heaps->list_).super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
             super__Vector_impl_data._M_start
             [(order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start[lVar4]];
    (**pIVar1->_vptr_IHeap)
              (pIVar1,(ulong)(uint)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[lVar4]);
  }
  return;
}

Assistant:

void generateHeaps(int size, int heapNumber, HeapList& heaps, std::vector<int>& order, std::vector<int>& values) {

    for (int i = 0; i < std::min(heapNumber, size); i++)
        heaps.AddHeap(values[i]);

    for (int i = std::min(heapNumber, size); i < size; i++)
        heaps.Insert(order[i], values[i]);
}